

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_BddToCubeArray(DdManager *dd,DdNode *cube,int *array)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  DdNode **ppDVar6;
  DdNode *pDVar7;
  DdNode *e;
  DdNode *t;
  DdNode *local_40;
  DdNode *local_38;
  
  uVar3 = Cudd_ReadSize(dd);
  pDVar7 = dd->one;
  if (0 < (int)uVar3) {
    lVar5 = (ulong)uVar3 + 1;
    do {
      array[lVar5 + -2] = 2;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
  do {
    iVar1 = *(int *)((ulong)cube & 0xfffffffffffffffe);
    if ((long)iVar1 == 0x7fffffff) {
      return (uint)(cube != pDVar7);
    }
    cuddGetBranches(cube,&local_38,&local_40);
    if (local_38 == pDVar7) {
      iVar4 = 0;
      ppDVar6 = &local_40;
LAB_007f6f51:
      array[iVar1] = iVar4;
      cube = *ppDVar6;
      bVar2 = true;
    }
    else {
      if (local_40 == pDVar7) {
        iVar4 = 1;
        ppDVar6 = &local_38;
        goto LAB_007f6f51;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int
Cudd_BddToCubeArray(
  DdManager *dd,
  DdNode *cube,
  int *array)
{
    DdNode *scan, *t, *e;
    int i;
    int size = Cudd_ReadSize(dd);
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    for (i = size-1; i >= 0; i--) {
        array[i] = 2;
    }
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        int index = Cudd_Regular(scan)->index;
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            array[index] = 0;
            scan = e;
        } else if (e == zero) {
            array[index] = 1;
            scan = t;
        } else {
            return(0);  /* cube is not a cube */
        }
    }
    if (scan == zero) {
        return(0);
    } else {
        return(1);
    }

}